

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.h
# Opt level: O2

void __thiscall TextFile::writeFormat<char*>(TextFile *this,wchar_t *text,char **args)

{
  size_t in_RCX;
  void *__buf;
  wstring message;
  wstring local_30;
  
  formatString<char*>(&local_30,text,args);
  write(this,(int)&local_30,__buf,in_RCX);
  std::__cxx11::wstring::~wstring((wstring *)&local_30);
  return;
}

Assistant:

void writeFormat(const wchar_t* text, const Args&... args)
	{
		std::wstring message = formatString(text,args...);
		write(message);
	}